

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_document_append_mapping_pair(yaml_document_t *document,int mapping,int key,int value)

{
  yaml_node_t *pyVar1;
  yaml_node_t *pyVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x55c,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
  }
  if (0 < mapping) {
    pyVar1 = (document->nodes).start;
    pyVar2 = (document->nodes).top;
    if (pyVar1 + (uint)mapping <= pyVar2) {
      uVar5 = mapping - 1;
      if (pyVar1[uVar5].type != YAML_MAPPING_NODE) {
        __assert_fail("document->nodes.start[mapping-1].type == YAML_MAPPING_NODE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                      ,0x560,
                      "int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
      }
      if ((key < 1) || (pyVar2 < pyVar1 + (uint)key)) {
        __assert_fail("key > 0 && document->nodes.start + key <= document->nodes.top",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                      ,0x562,
                      "int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
      }
      if ((value < 1) || (pyVar2 < pyVar1 + (uint)value)) {
        __assert_fail("value > 0 && document->nodes.start + value <= document->nodes.top",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                      ,0x564,
                      "int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
      }
      if ((pyVar1[uVar5].data.sequence.items.top ==
           (yaml_node_item_t *)pyVar1[uVar5].data.scalar.length) &&
         (iVar4 = yaml_stack_extend((void **)&pyVar1[uVar5].data,
                                    (void **)((long)&pyVar1[uVar5].data + 0x10),
                                    (void **)&pyVar1[uVar5].data.scalar.length), iVar4 == 0)) {
        return 0;
      }
      pyVar1 = (document->nodes).start;
      piVar3 = pyVar1[uVar5].data.sequence.items.top;
      pyVar1[uVar5].data.sequence.items.top = piVar3 + 2;
      *piVar3 = key;
      piVar3[1] = value;
      return 1;
    }
  }
  __assert_fail("mapping > 0 && document->nodes.start + mapping <= document->nodes.top",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0x55e,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
}

Assistant:

YAML_DECLARE(int)
yaml_document_append_mapping_pair(yaml_document_t *document,
        int mapping, int key, int value)
{
    struct {
        yaml_error_type_t error;
    } context;

    yaml_node_pair_t pair;

    assert(document);       /* Non-NULL document is required. */
    assert(mapping > 0
            && document->nodes.start + mapping <= document->nodes.top);
                            /* Valid mapping id is required. */
    assert(document->nodes.start[mapping-1].type == YAML_MAPPING_NODE);
                            /* A mapping node is required. */
    assert(key > 0 && document->nodes.start + key <= document->nodes.top);
                            /* Valid key id is required. */
    assert(value > 0 && document->nodes.start + value <= document->nodes.top);
                            /* Valid value id is required. */

    pair.key = key;
    pair.value = value;

    if (!PUSH(&context,
                document->nodes.start[mapping-1].data.mapping.pairs, pair))
        return 0;

    return 1;
}